

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_container(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lyd_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  char *pcVar4;
  lysp_node **pplVar5;
  char *format;
  ly_stmt parent_stmt;
  lysp_restr **extraout_RDX;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_00;
  ly_ctx *plVar6;
  lysp_node *plVar7;
  lysp_ext_instance **exts;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff40;
  ly_stmt local_b4;
  lysp_ext_instance **local_b0;
  char **local_a8;
  char *local_a0;
  size_t local_98;
  uint16_t *local_90;
  lysp_qname **local_88;
  lysp_ext_instance **local_80;
  lysp_node **local_78;
  lysp_qname **local_70;
  lysp_node **local_68;
  uint16_t *local_60;
  lysp_node **local_58;
  char **local_50;
  lysp_node *local_48;
  char **local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node *)calloc(1,0x80);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_container");
  }
  else {
    plVar7 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar7;
        plVar7 = plVar3->next;
      } while (plVar7 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 1;
    parent_00->parent = parent;
    exts = &local_38;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_a0,(char **)exts,&local_98);
    if (LVar2 == LY_SUCCESS) {
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = local_a0;
        if (local_98 == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar6,pcVar4,local_98,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar6,local_a0,&parent_00->name);
      }
      if (((LVar2 == LY_SUCCESS) &&
          (LVar2 = get_keyword(ctx,&local_b4,&local_a0,&local_98), LVar2 == LY_SUCCESS)) &&
         (LVar2 = LY_SUCCESS, local_b4 != LY_STMT_SYNTAX_SEMICOLON)) {
        if (local_b4 == LY_STMT_SYNTAX_LEFT_BRACE) {
          LVar2 = get_keyword(ctx,&local_b4,&local_a0,&local_98);
          if ((LVar2 == LY_SUCCESS) && (LVar2 = LY_SUCCESS, local_b4 != LY_STMT_SYNTAX_RIGHT_BRACE))
          {
            local_b0 = &parent_00->exts;
            local_80 = &parent_00[1].exts;
            local_40 = &parent_00[1].dsc;
            local_88 = &parent_00[1].iffeatures;
            local_48 = parent_00 + 1;
            local_50 = &parent_00[1].name;
            local_a8 = &parent_00[1].ref;
            local_58 = &parent_00[1].next;
            local_60 = &parent_00[1].nodetype;
            local_90 = &parent_00->flags;
            local_68 = (lysp_node **)&parent_00->ref;
            local_70 = &parent_00->iffeatures;
            local_78 = (lysp_node **)&parent_00->dsc;
            restrs = extraout_RDX;
            do {
              if ((int)local_b4 < 0x8000) {
                if ((int)local_b4 < 0x400) {
                  if ((int)local_b4 < 0x20) {
                    if (local_b4 == LY_STMT_NOTIFICATION) {
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar1[2].schema < 2) {
                        plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
                        pcVar4 = "notification";
LAB_00177168:
                        format = 
                        "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                        ;
                        goto LAB_0017719c;
                      }
                      LVar2 = parse_notif(ctx,parent_00,(lysp_node_notif **)local_80);
                    }
                    else {
                      if (local_b4 != LY_STMT_ACTION) goto LAB_0017710a;
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar1[2].schema < 2) {
                        plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
                        pcVar4 = "action";
                        goto LAB_00177168;
                      }
                      LVar2 = parse_action(ctx,parent_00,(lysp_node_action **)local_88);
                    }
                  }
                  else {
                    if (local_b4 == LY_STMT_ANYDATA) {
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar1[2].schema < 2) {
                        plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
                        pcVar4 = "anydata";
                        goto LAB_00177168;
                      }
                    }
                    else if (local_b4 != LY_STMT_ANYXML) {
                      if (local_b4 != LY_STMT_CHOICE) goto LAB_0017710a;
                      LVar2 = parse_choice(ctx,parent_00,(lysp_node **)local_a8);
                      goto LAB_0017705d;
                    }
                    LVar2 = parse_any(ctx,local_b4,parent_00,(lysp_node **)local_a8);
                  }
                }
                else if ((int)local_b4 < 0x1000) {
                  if (local_b4 == LY_STMT_CONTAINER) {
                    LVar2 = parse_container(ctx,parent_00,(lysp_node **)local_a8);
                  }
                  else {
                    if (local_b4 != LY_STMT_GROUPING) goto LAB_0017710a;
                    LVar2 = parse_grouping(ctx,parent_00,(lysp_node_grp **)local_40);
                  }
                }
                else if (local_b4 == LY_STMT_LEAF) {
                  LVar2 = parse_leaf(ctx,parent_00,(lysp_node **)local_a8);
                }
                else if (local_b4 == LY_STMT_LEAF_LIST) {
                  LVar2 = parse_leaflist(ctx,parent_00,(lysp_node **)local_a8);
                }
                else {
                  if (local_b4 != LY_STMT_LIST) goto LAB_0017710a;
                  LVar2 = parse_list(ctx,parent_00,(lysp_node **)local_a8);
                }
              }
              else if ((int)local_b4 < 0x1d0000) {
                if ((int)local_b4 < 0x80000) {
                  if (local_b4 == LY_STMT_USES) {
                    LVar2 = parse_uses(ctx,parent_00,(lysp_node **)local_a8);
                  }
                  else {
                    if (local_b4 != LY_STMT_CONFIG) {
LAB_0017710a:
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar6 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar6 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar4 = lyplg_ext_stmt2str(local_b4);
                      format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017719c:
                      ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar4,"container");
                      goto LAB_001770ff;
                    }
                    LVar2 = parse_config(ctx,local_90,local_b0);
                  }
                }
                else {
                  if (local_b4 == LY_STMT_DESCRIPTION) {
                    plVar7 = *local_78;
                    parent_stmt = LY_STMT_DESCRIPTION;
                    pplVar5 = local_78;
                    goto LAB_0017703d;
                  }
                  if (local_b4 == LY_STMT_EXTENSION_INSTANCE) {
                    exts = (lysp_ext_instance **)0x400;
                    LVar2 = parse_ext(ctx,local_a0,local_98,parent_00,LY_STMT_CONTAINER,0,local_b0);
                  }
                  else {
                    if (local_b4 != LY_STMT_IF_FEATURE) goto LAB_0017710a;
                    LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_70,(yang_arg)local_b0,exts);
                  }
                }
              }
              else if ((int)local_b4 < 0x2c0000) {
                if (local_b4 == LY_STMT_MUST) {
                  LVar2 = parse_restrs(ctx,(ly_stmt)local_48,restrs);
                }
                else {
                  if (local_b4 == LY_STMT_PRESENCE) {
                    plVar7 = *local_58;
                    parent_stmt = LY_STMT_PRESENCE;
                    pplVar5 = local_58;
                  }
                  else {
                    if (local_b4 != LY_STMT_REFERENCE) goto LAB_0017710a;
                    plVar7 = *local_68;
                    parent_stmt = LY_STMT_REFERENCE;
                    pplVar5 = local_68;
                  }
LAB_0017703d:
                  exts = (lysp_ext_instance **)0x2;
                  LVar2 = parse_text_field(ctx,plVar7,parent_stmt,(uint32_t)pplVar5,(char **)0x2,
                                           Y_IDENTIF_ARG,(uint16_t *)local_b0,
                                           in_stack_ffffffffffffff40);
                }
              }
              else if (local_b4 == LY_STMT_STATUS) {
                LVar2 = parse_status(ctx,local_90,local_b0);
              }
              else if (local_b4 == LY_STMT_TYPEDEF) {
                LVar2 = parse_typedef(ctx,parent_00,(lysp_tpdf **)local_50);
              }
              else {
                if (local_b4 != LY_STMT_WHEN) goto LAB_0017710a;
                LVar2 = parse_when(ctx,(lysp_when **)local_60);
              }
LAB_0017705d:
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              LVar2 = get_keyword(ctx,&local_b4,&local_a0,&local_98);
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              restrs = extraout_RDX_00;
            } while (local_b4 != LY_STMT_SYNTAX_RIGHT_BRACE);
            if ((*local_b0 == (lysp_ext_instance *)0x0) ||
               (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*local_b0,'\x01',(uint32_t *)0x0),
               LVar2 == LY_SUCCESS)) {
              LVar2 = LY_SUCCESS;
            }
          }
        }
        else {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar6 = (ly_ctx *)0x0;
          }
          else {
            plVar6 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(local_b4);
          ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
LAB_001770ff:
          LVar2 = LY_EVALID;
        }
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_container(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_container *cont;

    /* create new container structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, cont, next, LY_EMEM);
    cont->nodetype = LYS_CONTAINER;
    cont->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, cont->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &cont->flags, &cont->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, cont->dsc, LY_STMT_DESCRIPTION, 0, &cont->dsc, Y_STR_ARG, NULL, &cont->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &cont->iffeatures, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, cont->ref, LY_STMT_REFERENCE, 0, &cont->ref, Y_STR_ARG, NULL, &cont->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &cont->flags, &cont->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &cont->when));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(parse_text_field(ctx, cont->presence, LY_STMT_PRESENCE, 0, &cont->presence, Y_STR_ARG, NULL,
                    &cont->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "container");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)cont, &cont->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)cont, &cont->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &cont->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "container");
            LY_CHECK_RET(parse_action(ctx, (struct lysp_node *)cont, &cont->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)cont, &cont->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "container");
            LY_CHECK_RET(parse_notif(ctx, (struct lysp_node *)cont, &cont->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, cont, LY_STMT_CONTAINER, 0, &cont->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "container");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, cont->exts, ret, cleanup);
    }

cleanup:
    return ret;
}